

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O0

void __thiscall Steiner::solve(Steiner *this)

{
  bool bVar1;
  reference piVar2;
  reference pvVar3;
  ostream *poVar4;
  size_type sVar5;
  EVP_PKEY_CTX *ctx;
  Steiner *in_RDI;
  vector<Edge,_std::allocator<Edge>_> *in_stack_00000008;
  vector<Edge,_std::allocator<Edge>_> *in_stack_00000010;
  int eId_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  Edge *e;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Edge,_std::allocator<Edge>_> *__range1_1;
  uint iter;
  uint numIter;
  int eId;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  Steiner *in_stack_00000100;
  Steiner *in_stack_00000190;
  Steiner *in_stack_00000220;
  vector<Edge,_std::allocator<Edge>_> *in_stack_ffffffffffffff68;
  __normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> *in_stack_ffffffffffffff70;
  reference in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  int iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  vector<int,_std::allocator<int>_> *local_58;
  reference local_50;
  Edge *local_48;
  __normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> local_40;
  vector<Edge,_std::allocator<Edge>_> *local_38;
  uint local_2c;
  uint local_28;
  int local_24;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  buildRSG(in_stack_00000190);
  buildMST(in_stack_00000100);
  if ((gDoplot & 1U) != 0) {
    std::vector<Edge,_std::allocator<Edge>_>::operator=(in_stack_00000010,in_stack_00000008);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_00000010,
               (vector<int,_std::allocator<int>_> *)in_stack_00000008);
  }
  local_10 = &in_RDI->_MST;
  local_18._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68);
  local_20 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68);
  while( true ) {
    ctx = (EVP_PKEY_CTX *)&local_20;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff70,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff68);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_18);
    local_24 = *piVar2;
    pvVar3 = std::vector<Edge,_std::allocator<Edge>_>::operator[](&in_RDI->_edges,(long)local_24);
    in_RDI->_MST_cost = (long)pvVar3->weight + in_RDI->_MST_cost;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_18);
  }
  buildRST(in_stack_00000220);
  local_28 = 2;
  if (99 < in_RDI->_init_p) {
    local_28 = 3;
  }
  if (499 < in_RDI->_init_p) {
    local_28 = 4;
  }
  for (local_2c = 1; local_2c < local_28; local_2c = local_2c + 1) {
    init(in_RDI,ctx);
    buildRSG(in_stack_00000190);
    buildMST(in_stack_00000100);
    buildRST(in_stack_00000220);
  }
  local_38 = &in_RDI->_newE;
  local_40._M_current =
       (Edge *)std::vector<Edge,_std::allocator<Edge>_>::begin(in_stack_ffffffffffffff68);
  local_48 = (Edge *)std::vector<Edge,_std::allocator<Edge>_>::end(in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff70,
                            (__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> *)
                            in_stack_ffffffffffffff68), bVar1) {
    local_50 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
               operator*(&local_40);
    in_RDI->_MRST_cost = (long)local_50->weight + in_RDI->_MRST_cost;
    __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::operator++
              (&local_40);
  }
  local_58 = &in_RDI->_MST;
  local_60._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68);
  while( true ) {
    sVar5 = in_stack_ffffffffffffff80._M_mask;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff70,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff68);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_60);
    iVar6 = *piVar2;
    in_stack_ffffffffffffff80 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)CONCAT44(iVar6,in_stack_ffffffffffffff90)
                    ,sVar5);
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff80);
    if (!bVar1) {
      pvVar3 = std::vector<Edge,_std::allocator<Edge>_>::operator[](&in_RDI->_edges,(long)iVar6);
      in_RDI->_MRST_cost = (long)pvVar3->weight + in_RDI->_MRST_cost;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_60);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)in_RDI);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"RSG edge   : ");
  sVar5 = std::vector<Edge,_std::allocator<Edge>_>::size(&in_RDI->_edges);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"MST length : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI->_MST_cost);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"MRST length: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI->_MRST_cost);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Improvement: ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,((double)(in_RDI->_MST_cost - in_RDI->_MRST_cost) /
                             (double)in_RDI->_MST_cost) * 100.0);
  poVar4 = std::operator<<(poVar4,"%");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Steiner::solve() {
#ifdef VERBOSE
  TimeUsage timer;
#endif
  buildRSG();
#ifdef VERBOSE
  timer.showUsage("buildRSG", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  buildMST();
#ifdef VERBOSE
  timer.showUsage("buildMST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  if (gDoplot) {
    _init_edges = _edges;
    _init_MST = _MST;
  }
  for (int eId : _MST) _MST_cost += _edges[eId].weight;
  buildRST();
#ifdef VERBOSE
  timer.showUsage("buildRST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  unsigned numIter = 2;
  if (_init_p >= 10) numIter = 2;
  if (_init_p >= 100) numIter = 3;
  if (_init_p >= 500) numIter = 4;
  for (unsigned iter = 1; iter < numIter; ++iter) {
    init();
    buildRSG();
#ifdef VERBOSE
  timer.showUsage("buildRSG", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
    buildMST();
#ifdef VERBOSE
  timer.showUsage("buildMST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
    buildRST();
#ifdef VERBOSE
  timer.showUsage("buildRST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  }
  for (auto& e : _newE) _MRST_cost += e.weight;
  for (int eId : _MST) {
    if (_edges_del[eId]) continue;
    _MRST_cost += _edges[eId].weight;
  }
  cerr << _name << endl;
  cerr << "RSG edge   : " << _edges.size() << endl;
  cerr << "MST length : " << _MST_cost << endl;
  cerr << "MRST length: " << _MRST_cost << endl;
  cerr << "Improvement: "
       << (double)(_MST_cost - _MRST_cost) / _MST_cost * 100
       << "%" << endl;
}